

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
::
emplace_decomposable<int,std::piecewise_construct_t_const&,std::tuple<int_const&&>,std::tuple<phmap::priv::NonStandardLayout&&>>
          (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,int *key,size_t hashval,piecewise_construct_t *args,
          tuple<const_int_&&> *args_1,tuple<phmap::priv::NonStandardLayout_&&> *args_2)

{
  string *psVar1;
  NonStandardLayout *pNVar2;
  pointer pcVar3;
  long lVar4;
  size_t i;
  ctrl_t *pcVar5;
  bool bVar6;
  
  i = raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
      ::_find_key<int>((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
                        *)this,key,hashval);
  bVar6 = i == 0xffffffffffffffff;
  if (bVar6) {
    i = raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
        ::prepare_insert((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
                          *)this,hashval);
    lVar4 = *(long *)((long)this + 8);
    pNVar2 = (args_2->super__Tuple_impl<0UL,_phmap::priv::NonStandardLayout_&&>).
             super__Head_base<0UL,_phmap::priv::NonStandardLayout_&&,_false>._M_head_impl;
    psVar1 = (string *)(lVar4 + 0x10 + i * 0x30);
    *(int *)(psVar1 + -0x10) =
         *(args_1->super__Tuple_impl<0UL,_const_int_&&>).super__Head_base<0UL,_const_int_&&,_false>.
          _M_head_impl;
    *(undefined ***)(psVar1 + -8) = &PTR__NonStandardLayout_0034b120;
    lVar4 = lVar4 + 0x20 + i * 0x30;
    *(long *)(lVar4 + -0x10) = lVar4;
    pcVar3 = (pNVar2->value)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              (psVar1,pcVar3,pcVar3 + (pNVar2->value)._M_string_length);
    raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
    ::set_ctrl((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
                *)this,i,(byte)hashval & 0x7f);
    pcVar5 = (ctrl_t *)(i + *this);
  }
  else {
    pcVar5 = (ctrl_t *)(*this + i);
  }
  lVar4 = *(long *)((long)this + 8);
  (__return_storage_ptr__->first).ctrl_ = pcVar5;
  (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(i * 0x30 + lVar4);
  __return_storage_ptr__->second = bVar6;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable(const K& key, size_t hashval, 
                                                   Args&&... args)
    {
        size_t offset = _find_key(key, hashval);
        if (offset == (size_t)-1) {
            offset = prepare_insert(hashval);
            emplace_at(offset, std::forward<Args>(args)...);
            this->set_ctrl(offset, H2(hashval));
            return {iterator_at(offset), true};
        }
        return {iterator_at(offset), false};
    }